

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# class_support.h
# Opt level: O0

PyObject * pybind11::detail::make_new_python_type(type_record *rec)

{
  PyHeapTypeObject *pPVar1;
  bool bVar2;
  int iVar3;
  PyObject *pPVar4;
  size_t sVar5;
  size_t sVar6;
  PyObject **ppPVar7;
  char *pcVar8;
  handle *this;
  _typeobject *p_Var9;
  uint local_3d4;
  PyHeapTypeObject *local_360;
  PyObject *local_348;
  handle local_2d8;
  handle local_2d0;
  handle local_2c8;
  allocator local_299;
  string local_298 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238 [32];
  handle local_218;
  handle local_210;
  PyHeapTypeObject *local_208;
  PyTypeObject *type;
  handle local_1f8;
  allocator local_1e9;
  string local_1e8 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c8 [32];
  PyHeapTypeObject *local_1a8;
  PyHeapTypeObject *heap_type;
  PyTypeObject *metaclass;
  tuple_accessor local_190;
  PyObject *local_170;
  PyObject *base;
  tuple bases;
  internals *internals;
  size_t size;
  char *tp_doc;
  str local_140;
  object local_138 [4];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_118 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f8 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> full_name;
  str_attr_accessor local_d8;
  object local_b8;
  PyObject *local_b0;
  str_attr_accessor local_a8;
  object local_88;
  PyObject *local_80;
  handle local_78;
  object module;
  handle local_50;
  object local_48;
  PyObject *local_40;
  object local_28;
  object ht_qualname;
  handle local_18;
  object name;
  type_record *rec_local;
  
  name.super_handle.m_ptr = (handle)(handle)rec;
  pPVar4 = (PyObject *)PyUnicode_FromString(rec->name);
  handle::handle(&ht_qualname.super_handle,pPVar4);
  reinterpret_steal<pybind11::object>((pybind11 *)&local_18,ht_qualname.super_handle.m_ptr);
  object::object(&local_28,(object *)&local_18);
  bVar2 = handle::operator_cast_to_bool((handle *)name.super_handle.m_ptr);
  if (bVar2) {
    local_40 = *(PyObject **)name.super_handle.m_ptr;
    bVar2 = hasattr((handle)local_40,"__qualname__");
    if (bVar2) {
      object_api<pybind11::handle>::attr
                ((str_attr_accessor *)&module,
                 (object_api<pybind11::handle> *)name.super_handle.m_ptr,"__qualname__");
      pPVar4 = accessor<pybind11::detail::accessor_policies::str_attr>::ptr
                         ((accessor<pybind11::detail::accessor_policies::str_attr> *)&module);
      ppPVar7 = handle::ptr(&local_18);
      pPVar4 = (PyObject *)PyUnicode_FromFormat("%U.%U",pPVar4,*ppPVar7);
      handle::handle(&local_50,pPVar4);
      reinterpret_steal<pybind11::object>((pybind11 *)&local_48,local_50);
      object::operator=(&local_28,&local_48);
      object::~object(&local_48);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
                ((accessor<pybind11::detail::accessor_policies::str_attr> *)&module);
    }
  }
  object::object((object *)&local_78);
  bVar2 = handle::operator_cast_to_bool((handle *)name.super_handle.m_ptr);
  if (bVar2) {
    local_80 = *(PyObject **)name.super_handle.m_ptr;
    bVar2 = hasattr((handle)local_80,"__module__");
    if (bVar2) {
      object_api<pybind11::handle>::attr
                (&local_a8,(object_api<pybind11::handle> *)name.super_handle.m_ptr,"__module__");
      accessor::operator_cast_to_object((accessor *)&local_88);
      object::operator=((object *)&local_78,&local_88);
      object::~object(&local_88);
      accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_a8);
    }
    else {
      local_b0 = *(PyObject **)name.super_handle.m_ptr;
      bVar2 = hasattr((handle)local_b0,"__name__");
      if (bVar2) {
        object_api<pybind11::handle>::attr
                  (&local_d8,(object_api<pybind11::handle> *)name.super_handle.m_ptr,"__name__");
        accessor::operator_cast_to_object((accessor *)&local_b8);
        object::operator=((object *)&local_78,&local_b8);
        object::~object(&local_b8);
        accessor<pybind11::detail::accessor_policies::str_attr>::~accessor(&local_d8);
      }
    }
  }
  bVar2 = handle::operator_cast_to_bool(&local_78);
  tp_doc._7_1_ = 0;
  tp_doc._6_1_ = 0;
  tp_doc._5_1_ = 0;
  tp_doc._3_1_ = 0;
  if (bVar2) {
    str::str(&local_140,(object *)&local_78);
    tp_doc._7_1_ = 1;
    object::cast<std::__cxx11::string>(local_138);
    tp_doc._6_1_ = 1;
    std::operator+(local_118,(char *)local_138);
    tp_doc._5_1_ = 1;
    std::operator+(local_f8,(char *)local_118);
  }
  else {
    pcVar8 = *(char **)((long)name.super_handle.m_ptr + 8);
    std::allocator<char>::allocator();
    tp_doc._3_1_ = 1;
    std::__cxx11::string::string((string *)local_f8,pcVar8,(allocator *)((long)&tp_doc + 4));
  }
  if ((tp_doc._3_1_ & 1) != 0) {
    std::allocator<char>::~allocator((allocator<char> *)((long)&tp_doc + 4));
  }
  if ((tp_doc._5_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)local_118);
  }
  if ((tp_doc._6_1_ & 1) != 0) {
    std::__cxx11::string::~string((string *)local_138);
  }
  if ((tp_doc._7_1_ & 1) != 0) {
    str::~str(&local_140);
  }
  size = 0;
  if ((*(long *)((long)name.super_handle.m_ptr + 0x48) != 0) &&
     (bVar2 = options::show_user_defined_docstrings(), bVar2)) {
    sVar5 = strlen(*(char **)((long)name.super_handle.m_ptr + 0x48));
    size = PyObject_Malloc(sVar5 + 1);
    memcpy((void *)size,*(void **)((long)name.super_handle.m_ptr + 0x48),sVar5 + 1);
  }
  bases.super_object.super_handle.m_ptr = (object)get_internals();
  tuple::tuple((tuple *)&base,(object *)((long)name.super_handle.m_ptr + 0x40));
  metaclass._7_1_ = 0;
  sVar6 = tuple::size((tuple *)&base);
  if (sVar6 == 0) {
    local_348 = *(PyObject **)((long)bases.super_object.super_handle.m_ptr + 0x168);
  }
  else {
    tuple::operator[](&local_190,(tuple *)&base,0);
    metaclass._7_1_ = 1;
    local_348 = accessor<pybind11::detail::accessor_policies::tuple_item>::ptr(&local_190);
  }
  if ((metaclass._7_1_ & 1) != 0) {
    accessor<pybind11::detail::accessor_policies::tuple_item>::~accessor(&local_190);
  }
  local_170 = local_348;
  pPVar4 = handle::ptr((handle *)((long)name.super_handle.m_ptr + 0x50));
  if (pPVar4 == (PyObject *)0x0) {
    local_360 = *(PyHeapTypeObject **)((long)bases.super_object.super_handle.m_ptr + 0x160);
  }
  else {
    local_360 = (PyHeapTypeObject *)handle::ptr((handle *)((long)name.super_handle.m_ptr + 0x50));
  }
  heap_type = local_360;
  local_1a8 = (PyHeapTypeObject *)(*(local_360->ht_type).tp_alloc)(&local_360->ht_type,0);
  if (local_1a8 != (PyHeapTypeObject *)0x0) {
    local_1f8 = object::release((object *)&local_18);
    ppPVar7 = handle::ptr(&local_1f8);
    local_1a8->ht_name = *ppPVar7;
    type = (PyTypeObject *)object::release(&local_28);
    ppPVar7 = handle::ptr((handle *)&type);
    local_1a8->ht_qualname = *ppPVar7;
    local_208 = local_1a8;
    pcVar8 = (char *)std::__cxx11::string::c_str();
    pcVar8 = strdup(pcVar8);
    (local_208->ht_type).tp_name = pcVar8;
    (local_208->ht_type).tp_doc = (char *)size;
    handle::handle(&local_210,local_170);
    this = handle::inc_ref(&local_210);
    p_Var9 = (_typeobject *)handle::ptr(this);
    (local_208->ht_type).tp_base = p_Var9;
    (local_208->ht_type).tp_basicsize = 0x38;
    sVar6 = tuple::size((tuple *)&base);
    if (sVar6 != 0) {
      local_218 = object::release((object *)&base);
      ppPVar7 = handle::ptr(&local_218);
      (local_208->ht_type).tp_bases = *ppPVar7;
    }
    (local_208->ht_type).tp_init = pybind11_object_init;
    (local_208->ht_type).tp_as_number = &local_1a8->as_number;
    (local_208->ht_type).tp_as_sequence = &local_1a8->as_sequence;
    (local_208->ht_type).tp_as_mapping = &local_1a8->as_mapping;
    (local_208->ht_type).tp_flags = (local_208->ht_type).tp_flags | 0x600;
    if ((*(byte *)((long)name.super_handle.m_ptr + 0x58) >> 1 & 1) != 0) {
      enable_dynamic_attributes(local_1a8);
    }
    if ((*(byte *)((long)name.super_handle.m_ptr + 0x58) >> 2 & 1) != 0) {
      enable_buffer_protocol(local_1a8);
    }
    iVar3 = PyType_Ready(local_208);
    if (-1 < iVar3) {
      if ((*(byte *)((long)name.super_handle.m_ptr + 0x58) >> 1 & 1) == 0) {
        iVar3 = PyType_HasFeature(&local_208->ht_type,0x4000);
        local_3d4 = (uint)((iVar3 != 0 ^ 0xffU) & 1);
      }
      else {
        local_3d4 = PyType_HasFeature(&local_208->ht_type,0x4000);
      }
      if (local_3d4 == 0) {
        __assert_fail("rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC) : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/shibasisp[P]pybind11-examples/pybind11/include/pybind11/class_support.h"
                      ,0x22e,"PyObject *pybind11::detail::make_new_python_type(const type_record &)"
                     );
      }
      bVar2 = handle::operator_cast_to_bool((handle *)name.super_handle.m_ptr);
      if (bVar2) {
        local_2c8.m_ptr = *name.super_handle.m_ptr;
        pcVar8 = *(char **)((long)name.super_handle.m_ptr + 8);
        handle::handle(&local_2d0,(PyObject *)local_208);
        setattr(local_2c8,pcVar8,local_2d0);
      }
      bVar2 = handle::operator_cast_to_bool(&local_78);
      if (bVar2) {
        handle::handle(&local_2d8,(PyObject *)local_208);
        setattr(local_2d8,"__module__",local_78);
      }
      pPVar1 = local_208;
      tuple::~tuple((tuple *)&base);
      std::__cxx11::string::~string((string *)local_f8);
      object::~object((object *)&local_78);
      object::~object(&local_28);
      object::~object((object *)&local_18);
      return (PyObject *)pPVar1;
    }
    pcVar8 = *(char **)((long)name.super_handle.m_ptr + 8);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_298,pcVar8,&local_299);
    std::operator+(local_278,(char *)local_298);
    error_string_abi_cxx11_();
    std::operator+(local_258,local_278);
    std::operator+(local_238,(char *)local_258);
    pybind11_fail(local_238);
  }
  pcVar8 = *(char **)((long)name.super_handle.m_ptr + 8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_1e8,pcVar8,&local_1e9);
  std::operator+(local_1c8,(char *)local_1e8);
  pybind11_fail(local_1c8);
}

Assistant:

inline PyObject* make_new_python_type(const type_record &rec) {
    auto name = reinterpret_steal<object>(PYBIND11_FROM_STRING(rec.name));

#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
    auto ht_qualname = name;
    if (rec.scope && hasattr(rec.scope, "__qualname__")) {
        ht_qualname = reinterpret_steal<object>(
            PyUnicode_FromFormat("%U.%U", rec.scope.attr("__qualname__").ptr(), name.ptr()));
    }
#endif

    object module;
    if (rec.scope) {
        if (hasattr(rec.scope, "__module__"))
            module = rec.scope.attr("__module__");
        else if (hasattr(rec.scope, "__name__"))
            module = rec.scope.attr("__name__");
    }

#if !defined(PYPY_VERSION)
    const auto full_name = module ? str(module).cast<std::string>() + "." + rec.name
                                  : std::string(rec.name);
#else
    const auto full_name = std::string(rec.name);
#endif

    char *tp_doc = nullptr;
    if (rec.doc && options::show_user_defined_docstrings()) {
        /* Allocate memory for docstring (using PyObject_MALLOC, since
           Python will free this later on) */
        size_t size = strlen(rec.doc) + 1;
        tp_doc = (char *) PyObject_MALLOC(size);
        memcpy((void *) tp_doc, rec.doc, size);
    }

    auto &internals = get_internals();
    auto bases = tuple(rec.bases);
    auto base = (bases.size() == 0) ? internals.instance_base
                                    : bases[0].ptr();

    /* Danger zone: from now (and until PyType_Ready), make sure to
       issue no Python C API calls which could potentially invoke the
       garbage collector (the GC will call type_traverse(), which will in
       turn find the newly constructed type in an invalid state) */
    auto metaclass = rec.metaclass.ptr() ? (PyTypeObject *) rec.metaclass.ptr()
                                         : internals.default_metaclass;

    auto heap_type = (PyHeapTypeObject *) metaclass->tp_alloc(metaclass, 0);
    if (!heap_type)
        pybind11_fail(std::string(rec.name) + ": Unable to create type object!");

    heap_type->ht_name = name.release().ptr();
#if PY_MAJOR_VERSION >= 3 && PY_MINOR_VERSION >= 3
    heap_type->ht_qualname = ht_qualname.release().ptr();
#endif

    auto type = &heap_type->ht_type;
    type->tp_name = strdup(full_name.c_str());
    type->tp_doc = tp_doc;
    type->tp_base = (PyTypeObject *) handle(base).inc_ref().ptr();
    type->tp_basicsize = static_cast<ssize_t>(sizeof(instance));
    if (bases.size() > 0)
        type->tp_bases = bases.release().ptr();

    /* Don't inherit base __init__ */
    type->tp_init = pybind11_object_init;

    /* Supported protocols */
    type->tp_as_number = &heap_type->as_number;
    type->tp_as_sequence = &heap_type->as_sequence;
    type->tp_as_mapping = &heap_type->as_mapping;

    /* Flags */
    type->tp_flags |= Py_TPFLAGS_DEFAULT | Py_TPFLAGS_BASETYPE | Py_TPFLAGS_HEAPTYPE;
#if PY_MAJOR_VERSION < 3
    type->tp_flags |= Py_TPFLAGS_CHECKTYPES;
#endif

    if (rec.dynamic_attr)
        enable_dynamic_attributes(heap_type);

    if (rec.buffer_protocol)
        enable_buffer_protocol(heap_type);

    if (PyType_Ready(type) < 0)
        pybind11_fail(std::string(rec.name) + ": PyType_Ready failed (" + error_string() + ")!");

    assert(rec.dynamic_attr ? PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC)
                            : !PyType_HasFeature(type, Py_TPFLAGS_HAVE_GC));

    /* Register type with the parent scope */
    if (rec.scope)
        setattr(rec.scope, rec.name, (PyObject *) type);

    if (module) // Needed by pydoc
        setattr((PyObject *) type, "__module__", module);

    return (PyObject *) type;
}